

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_symbol_codec.cpp
# Opt level: O0

void __thiscall crnlib::symbol_codec::assemble_output_buf(symbol_codec *this,bool support_arith)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  byte *pbVar4;
  output_symbol *poVar5;
  uint uVar6;
  uint local_54;
  uint bit;
  uint x;
  uint c_1;
  output_symbol *sym;
  uint sym_index;
  uint c;
  uint i;
  uint arith_buf_ofs;
  bool support_arith_local;
  symbol_codec *this_local;
  
  this->m_total_bits_written = 0;
  c = 0;
  if (support_arith) {
    uVar2 = vector<unsigned_char>::size(&this->m_arith_output_buf);
    if (uVar2 == 0) {
      put_bits(this,0,1);
    }
    else {
      put_bits(this,1,1);
      this->m_arith_length = 0xffffffff;
      this->m_arith_value = 0;
      for (sym_index = 0; sym_index < 4; sym_index = sym_index + 1) {
        pbVar4 = vector<unsigned_char>::operator[](&this->m_arith_output_buf,c);
        bVar1 = *pbVar4;
        this->m_arith_value = this->m_arith_value << 8 | (uint)bVar1;
        put_bits(this,(uint)bVar1,8);
        c = c + 1;
      }
    }
  }
  for (sym._4_4_ = 0;
      uVar2 = vector<crnlib::symbol_codec::output_symbol>::size(&this->m_output_syms),
      sym._4_4_ < uVar2; sym._4_4_ = sym._4_4_ + 1) {
    poVar5 = vector<crnlib::symbol_codec::output_symbol>::operator[](&this->m_output_syms,sym._4_4_)
    ;
    if (poVar5->m_num_bits == -2) {
      put_bits_align_to_byte(this);
    }
    else if (poVar5->m_num_bits == -1) {
      uVar3 = this->m_arith_length;
      while (uVar3 < 0x1000000) {
        uVar2 = vector<unsigned_char>::size(&this->m_arith_output_buf);
        if (c < uVar2) {
          pbVar4 = vector<unsigned_char>::operator[](&this->m_arith_output_buf,c);
          local_54 = (uint)*pbVar4;
          c = c + 1;
        }
        else {
          local_54 = 0;
        }
        put_bits(this,local_54,8);
        this->m_arith_value = this->m_arith_value << 8 | local_54;
        uVar3 = this->m_arith_length << 8;
        this->m_arith_length = uVar3;
      }
      uVar6 = (uint)poVar5->m_arith_prob0 * (this->m_arith_length >> 0xb);
      uVar3 = (uint)(uVar6 <= this->m_arith_value);
      if (uVar3 == 0) {
        this->m_arith_length = uVar6;
      }
      else {
        this->m_arith_value = this->m_arith_value - uVar6;
        this->m_arith_length = this->m_arith_length - uVar6;
      }
      if (uVar3 != poVar5->m_bits) {
        crnlib_assert("bit == sym.m_bits",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/FrozenStormInteractive[P]Crunch2/crnlib/crn_symbol_codec.cpp"
                      ,0x5c3);
      }
    }
    else {
      put_bits(this,poVar5->m_bits,(int)poVar5->m_num_bits);
    }
  }
  flush_bits(this);
  return;
}

Assistant:

void symbol_codec::assemble_output_buf(bool support_arith)
    {
        m_total_bits_written = 0;

        uint arith_buf_ofs = 0;

        if (support_arith)
        {
            if (m_arith_output_buf.size())
            {
                put_bits(1, 1);

                m_arith_length = cSymbolCodecArithMaxLen;
                m_arith_value = 0;
                for (uint i = 0; i < 4; i++)
                {
                    const uint c = m_arith_output_buf[arith_buf_ofs++];
                    m_arith_value = (m_arith_value << 8) | c;
                    put_bits(c, 8);
                }
            }
            else
            {
                put_bits(0, 1);
            }
        }

        for (uint sym_index = 0; sym_index < m_output_syms.size(); sym_index++)
        {
            const output_symbol& sym = m_output_syms[sym_index];

            if (sym.m_num_bits == output_symbol::cAlignToByteSym)
            {
                put_bits_align_to_byte();
            }
            else if (sym.m_num_bits == output_symbol::cArithSym)
            {
                if (m_arith_length < cSymbolCodecArithMinLen)
                {
                    do
                    {
                        const uint c = (arith_buf_ofs < m_arith_output_buf.size()) ? m_arith_output_buf[arith_buf_ofs++] : 0;
                        put_bits(c, 8);
                        m_arith_value = (m_arith_value << 8) | c;
                    } while ((m_arith_length <<= 8) < cSymbolCodecArithMinLen);
                }

                //uint x = gArithProbMulTab[sym.m_arith_prob0 >> (cSymbolCodecArithProbBits - cSymbolCodecArithProbMulBits)][m_arith_length >> (32 - cSymbolCodecArithProbMulLenSigBits)] << 16;
                uint x = sym.m_arith_prob0 * (m_arith_length >> cSymbolCodecArithProbBits);
                uint bit = (m_arith_value >= x);

                if (bit == 0)
                {
                    m_arith_length = x;
                }
                else
                {
                    m_arith_value -= x;
                    m_arith_length -= x;
                }

                CRNLIB_VERIFY(bit == sym.m_bits);
            }
            else
            {
                put_bits(sym.m_bits, sym.m_num_bits);
            }
        }

        flush_bits();
    }